

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall
QListWidgetItem::QListWidgetItem
          (QListWidgetItem *this,QIcon *icon,QString *text,QListWidget *listview,int type)

{
  int row;
  QListWidgetItemPrivate *pQVar1;
  QListModel *this_00;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QListWidgetItem = (_func_int **)&PTR__QListWidgetItem_007e8358;
  this->rtti = type;
  this->view = listview;
  pQVar1 = (QListWidgetItemPrivate *)operator_new(0x28);
  pQVar1->q = this;
  (pQVar1->values).d.size = 0;
  (pQVar1->values).d.d = (Data *)0x0;
  (pQVar1->values).d.ptr = (QWidgetItemData *)0x0;
  pQVar1->theid = -1;
  this->d = pQVar1;
  (this->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i =
       0x35;
  this_00 = listModel(this);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_68,(QObject *)this->view);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QSignalBlocker::QSignalBlocker((QSignalBlocker *)local_78,(QObject *)this_00);
  ::QVariant::QVariant((QVariant *)&local_58,(QString *)text);
  (*this->_vptr_QListWidgetItem[4])(this,0,&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QIcon::operator_cast_to_QVariant((QVariant *)&local_58,icon);
  (*this->_vptr_QListWidgetItem[4])(this,1,&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_78);
  QSignalBlocker::~QSignalBlocker((QSignalBlocker *)local_68);
  if (this_00 != (QListModel *)0x0) {
    local_58._forAlignment = -NAN;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    row = (**(code **)(*(long *)this_00 + 0x78))(this_00);
    QListModel::insert(this_00,row,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QListWidgetItem::QListWidgetItem(const QIcon &icon,const QString &text,
                                 QListWidget *listview, int type)
    : rtti(type), view(listview), d(new QListWidgetItemPrivate(this)),
      itemFlags(Qt::ItemIsSelectable
                |Qt::ItemIsUserCheckable
                |Qt::ItemIsEnabled
                |Qt::ItemIsDragEnabled)
{
    QListModel *model = listModel();
    {
        QSignalBlocker b(view);
        QSignalBlocker bm(model);
        setData(Qt::DisplayRole, text);
        setData(Qt::DecorationRole, icon);
    }
    if (model)
        model->insert(model->rowCount(), this);
}